

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall slang::ast::Compilation::elaborate(Compilation *this)

{
  char_pointer puVar1;
  char_pointer puVar2;
  _Alloc_hider *p_Var3;
  SymbolKind SVar4;
  undefined4 uVar5;
  pointer ppVar6;
  BindDirectiveSyntax *syntax;
  pointer ppCVar7;
  size_t sVar8;
  InstanceSymbol *pIVar9;
  InstanceBodySymbol *pIVar10;
  pointer ppSVar11;
  SourceLocation location;
  pointer ppDVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports;
  undefined8 uVar15;
  RootSymbol *pRVar16;
  Symbol *pSVar17;
  Diagnostic *pDVar18;
  char_pointer puVar19;
  char_pointer puVar20;
  pointer ppIVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  pointer ppVar25;
  pointer ppDVar26;
  pointer ppCVar27;
  value_type *elements;
  Compilation *this_00;
  Scope *pSVar28;
  ulong uVar29;
  InstanceSymbol *pIVar30;
  uint uVar31;
  type *key;
  table_element_pointer ppVar32;
  char_pointer puVar33;
  char_pointer puVar34;
  table_element_pointer ppVar35;
  bool bVar36;
  uchar uVar37;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  iterator iVar44;
  SourceRange SVar45;
  iterator iVar46;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos;
  span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
  modports;
  LookupLocation location_00;
  DefinitionSymbol *def;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  newUnreferencedDefs;
  DiagnosticVisitor elabVisitor;
  DefinitionSymbol *local_290;
  undefined1 local_288 [64];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  ResolvedConfig *local_228;
  pointer local_218;
  SourceRange local_210;
  undefined1 local_200 [20];
  bool local_1ec;
  bool local_1eb;
  bool local_1ea;
  size_t local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [16];
  group_type_pointer local_198;
  value_type_pointer local_190;
  size_t local_188;
  ulong local_180;
  undefined1 local_178 [16];
  pointer local_168;
  pointer local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  pointer local_150;
  Segment *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  BumpAllocator *local_118;
  __extent_storage<18446744073709551615UL> local_110;
  BumpAllocator *local_108;
  BumpAllocator local_100 [2];
  Type *local_d8;
  __extent_storage<18446744073709551615UL> local_d0;
  Type *local_c8;
  undefined1 local_c0 [48];
  Type *local_90;
  Type *local_88;
  undefined1 local_80 [64];
  size_t local_40;
  _Elt_pointer local_38;
  
  local_200._16_4_ = (this->options).errorLimit;
  local_200._16_4_ = -(uint)(local_200._16_4_ == 0) | local_200._16_4_;
  local_200._8_8_ = &this->numErrors;
  local_158 = &local_140;
  local_1ec = true;
  local_1eb = false;
  local_1ea = false;
  local_1e8 = 0x3f;
  local_1e0 = 1;
  local_1d8 = ZEXT816(0x51f2f0);
  local_1c8 = 0;
  local_1c0 = 0;
  local_1b8 = 0x3f;
  local_1b0 = 1;
  local_1a8 = ZEXT816(0x51f2f0);
  local_198 = (group_type_pointer)0x0;
  local_190 = (value_type_pointer)0x0;
  local_188 = 0x3f;
  local_180 = 1;
  local_178 = ZEXT816(0x51f2f0);
  local_168 = (pointer)0x0;
  local_160 = (pointer)0x0;
  local_150 = (pointer)0x0;
  local_148 = (Segment *)0x5;
  local_118 = local_100;
  local_110._M_extent_value = 0;
  local_108 = (BumpAllocator *)0x5;
  local_d8 = (Type *)local_c0;
  local_d0._M_extent_value = 0;
  local_c8 = (Type *)0x5;
  local_c0._40_8_ = local_80;
  local_90 = (Type *)0x0;
  local_88 = (Type *)0x2;
  local_80._32_8_ = (pointer)0x3f;
  local_80._40_8_ = (pointer)0x1;
  local_80._48_16_ = ZEXT816(0x51f2f0);
  local_40 = 0;
  local_38 = (_Elt_pointer)0x0;
  local_200._0_8_ = this;
  pRVar16 = getRoot(this,false);
  Symbol::visit<slang::ast::DiagnosticVisitor&>
            (&pRVar16->super_Symbol,(DiagnosticVisitor *)local_200);
  if (((ulong)(uint)local_200._16_4_ < *(ulong *)local_200._8_8_) || ((local_1ea & 1U) != 0)) {
    this->sawFatalError = true;
  }
  else {
    this_00 = (Compilation *)local_200;
    DiagnosticVisitor::finalize((DiagnosticVisitor *)this_00);
    if (((this->dpiExports).
         super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->dpiExports).
         super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (local_110._M_extent_value != 0)) {
      dpiImports._M_extent._M_extent_value = local_110._M_extent_value;
      dpiImports._M_ptr = (pointer)local_118;
      this_00 = this;
      checkDPIMethods(this,dpiImports);
    }
    if ((this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::vector((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                *)local_288,&this->externInterfaceMethods);
      uVar15 = local_288._8_8_;
      for (ppDVar26 = (pointer)local_288._0_8_; ppDVar26 != (pointer)uVar15; ppDVar26 = ppDVar26 + 1
          ) {
        SubroutineSymbol::connectExternInterfacePrototype((SubroutineSymbol *)*ppDVar26);
      }
      this_00 = (Compilation *)local_288._0_8_;
      if ((Compilation *)local_288._0_8_ != (Compilation *)0x0) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
      }
    }
    if (local_d0._M_extent_value != 0) {
      protos._M_extent._M_extent_value = local_d0._M_extent_value;
      protos._M_ptr = (pointer)local_d8;
      checkExternIfaceMethods(this_00,protos);
    }
    if (local_90 != (Type *)0x0) {
      modports._M_extent._M_extent_value = (size_t)local_90;
      modports._M_ptr = (pointer)local_c0._40_8_;
      checkModportExports(this_00,modports);
    }
    ppVar25 = (this->bindDirectives).
              super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->bindDirectives).
             super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar25 != ppVar6) {
      do {
        syntax = ppVar25->first;
        pSVar28 = ppVar25->second;
        local_288._8_8_ = 0;
        local_288._0_8_ = local_288 + 0x18;
        local_288._16_8_ = (group_type_pointer)0x5;
        local_228 = (ResolvedConfig *)0x0;
        local_238 = (undefined1  [16])0x0;
        local_248 = (undefined1  [16])0x0;
        resolveBindTargets(this,syntax,pSVar28,(ResolvedBind *)local_288);
        checkBindTargetParams(this,syntax,pSVar28,(ResolvedBind *)local_288);
        if ((undefined1 *)local_288._0_8_ != local_288 + 0x18) {
          operator_delete((void *)local_288._0_8_);
        }
        ppVar25 = ppVar25 + 1;
      } while (ppVar25 != ppVar6);
    }
    if ((this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
                ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 local_288,&this->nameConflicts);
      uVar15 = local_288._8_8_;
      for (ppDVar26 = (pointer)local_288._0_8_; ppDVar26 != (pointer)uVar15; ppDVar26 = ppDVar26 + 1
          ) {
        Scope::handleNameConflict
                  (((*ppDVar26)->super_Symbol).parentScope,&(*ppDVar26)->super_Symbol);
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
      }
    }
    if ((this->outOfBlockDecls).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
        .size_ctrl.size != 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)local_288,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)&this->outOfBlockDecls,
                   (allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>
                    *)&local_290);
      iVar44 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                        *)local_288);
      if (iVar44.p_ != (table_element_pointer)0x0) {
LAB_003dd8a5:
        ppVar32 = iVar44.p_;
        if ((ppVar32->second).
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
            .
            super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
            .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
            super__Head_base<3UL,_bool,_false>._M_head_impl != true) {
          SVar45 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              (((ppVar32->second).
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                .
                                super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                .
                                super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                               ._M_head_impl)->left).ptr);
          pSVar28 = (ppVar32->first).
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                    super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
          location_00.index =
               (ppVar32->second).
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .
               super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
               super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
          location_00.scope = pSVar28;
          location_00._12_4_ = 0;
          local_210 = SVar45;
          pSVar17 = Lookup::unqualifiedAt
                              (pSVar28,(ppVar32->first).
                                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .
                                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                       ._M_head_impl,location_00,SVar45,
                               (bitmask<slang::ast::LookupFlags>)0x0);
          if (((pSVar17 != (Symbol *)0x0) &&
              ((ppVar32->first).
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len != 0)) &&
             ((ppVar32->first).
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
              _M_head_impl._M_len != 0)) {
            if ((pSVar17->kind == GenericClassDef) || (pSVar17->kind == ClassType)) {
              pSVar28 = (ppVar32->first).
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .
                        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                        super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
              SVar45 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)
                                  (ppVar32->second).
                                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                                  ._M_head_impl);
              pDVar18 = Scope::addDiag(pSVar28,(DiagCode)0x1c000d,SVar45);
              pDVar18 = Diagnostic::operator<<
                                  (pDVar18,(ppVar32->first).
                                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           .
                                           super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           .
                                           super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                           ._M_head_impl);
              Diagnostic::operator<<
                        (pDVar18,(ppVar32->first).
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .
                                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                 ._M_head_impl);
            }
            else {
              pDVar18 = Scope::addDiag((ppVar32->first).
                                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .
                                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                                       super__Head_base<2UL,_const_slang::ast::Scope_*,_false>.
                                       _M_head_impl,(DiagCode)0x1e000a,SVar45);
              Diagnostic::operator<<
                        (pDVar18,(ppVar32->first).
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .
                                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                 ._M_head_impl);
            }
          }
        }
        puVar34 = iVar44.pc_ + 2;
        do {
          puVar19 = puVar34;
          puVar34 = iVar44.pc_;
          ppVar32 = iVar44.p_ + 1;
          if (((uint)iVar44.pc_ & 0xf) == 0xe) goto LAB_003dd9be;
          puVar1 = puVar19 + -1;
          iVar44.p_ = ppVar32;
          iVar44.pc_ = puVar34 + 1;
          puVar34 = puVar19 + 1;
        } while (*puVar1 == '\0');
        puVar19 = puVar19 + -1;
        if (*puVar1 == '\x01') {
          ppVar32 = (table_element_pointer)0x0;
        }
        goto LAB_003dd9ab;
      }
LAB_003dda0d:
      if ((char  [8])local_288._24_8_ != (char  [8])0x0) {
        operator_delete((void *)local_288._24_8_,
                        local_288._8_8_ * 0x3d0 + 0x3d0U & 0xffffffffffffffc0);
      }
    }
    if (((this->configBlocks).table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
         .size_ctrl.size != 0) &&
       (iVar46 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 ::begin(&(this->configBlocks).table_), iVar46.p_ != (table_element_pointer)0x0)) {
LAB_003dda68:
      ppCVar7 = ((iVar46.p_)->second).
                super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar27 = ((iVar46.p_)->second).
                      super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar27 != ppCVar7;
          ppCVar27 = ppCVar27 + 1) {
        if ((*ppCVar27)->isUsed == true) {
          ConfigBlockSymbol::checkUnusedRules(*ppCVar27);
        }
      }
      puVar20 = iVar46.pc_ + 2;
      do {
        puVar33 = puVar20;
        puVar20 = iVar46.pc_;
        ppVar35 = iVar46.p_ + 1;
        if (((uint)iVar46.pc_ & 0xf) == 0xe) goto LAB_003ddac2;
        puVar2 = puVar33 + -1;
        iVar46.p_ = ppVar35;
        iVar46.pc_ = puVar20 + 1;
        puVar20 = puVar33 + 1;
      } while (*puVar2 == '\0');
      puVar33 = puVar33 + -1;
      if (*puVar2 == '\x01') {
        ppVar35 = (table_element_pointer)0x0;
      }
      goto LAB_003ddab6;
    }
LAB_003ddb14:
    if (((this->options).flags.m_bits & 0x10) == 0) {
      pRVar16 = getRoot(this,false);
      sVar8 = (pRVar16->topInstances)._M_extent._M_extent_value;
      if (sVar8 != 0) {
        ppIVar21 = (pRVar16->topInstances)._M_ptr;
        local_218 = ppIVar21 + sVar8;
        do {
          pIVar9 = *ppIVar21;
          pIVar10 = pIVar9->body;
          if ((pIVar10->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pIVar10->super_Scope);
          }
          sVar8 = (pIVar10->portList)._M_extent._M_extent_value;
          if (sVar8 != 0) {
            ppSVar11 = (pIVar10->portList)._M_ptr;
            lVar23 = 0;
            do {
              pIVar30 = *(InstanceSymbol **)((long)ppSVar11 + lVar23);
              SVar4 = (pIVar30->super_InstanceSymbolBase).super_Symbol.kind;
              if (SVar4 == InterfacePort) {
                pDVar18 = Scope::addDiag(&pIVar9->body->super_Scope,(DiagCode)0x1d000d,
                                         (pIVar30->super_InstanceSymbolBase).super_Symbol.location);
                pDVar18 = Diagnostic::operator<<
                                    (pDVar18,(pIVar9->super_InstanceSymbolBase).super_Symbol.name);
                Diagnostic::operator<<
                          (pDVar18,(pIVar30->super_InstanceSymbolBase).super_Symbol.name);
              }
              else if (*(int *)&pIVar30->body == 3) {
                pSVar28 = &pIVar9->body->super_Scope;
                location = (pIVar30->super_InstanceSymbolBase).super_Symbol.location;
                if ((pIVar30->super_InstanceSymbolBase).super_Symbol.name._M_len == 0) {
                  pDVar18 = Scope::addDiag(pSVar28,(DiagCode)0x1f000d,location);
                  pIVar30 = pIVar9;
                }
                else {
                  pDVar18 = Scope::addDiag(pSVar28,(DiagCode)0x1e000d,location);
                  pDVar18 = Diagnostic::operator<<
                                      (pDVar18,(pIVar9->super_InstanceSymbolBase).super_Symbol.name)
                  ;
                }
                Diagnostic::operator<<
                          (pDVar18,(pIVar30->super_InstanceSymbolBase).super_Symbol.name);
              }
            } while ((SVar4 != InterfacePort) &&
                    (bVar36 = sVar8 * 8 + -8 != lVar23, lVar23 = lVar23 + 8, bVar36));
          }
          ppIVar21 = ppIVar21 + 1;
        } while (ppIVar21 != local_218);
      }
    }
    local_288._0_16_ = (undefined1  [16])0x0;
    local_288._16_8_ = (group_type_pointer)0x0;
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::reserve((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               *)local_288,
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppDVar12 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppDVar26 = (this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppDVar26 != ppDVar12;
        ppDVar26 = ppDVar26 + 1) {
      local_290 = *ppDVar26;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_290;
      uVar24 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar22 = uVar24 >> ((byte)local_188 & 0x3f);
      uVar5 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar24 & 0xff];
      uVar29 = 0;
      do {
        p_Var3 = (_Alloc_hider *)local_178._0_8_ + uVar22 * 2;
        uVar37 = (uchar)uVar5;
        auVar43[0] = -(*(uchar *)&p_Var3->_M_p == uVar37);
        uVar40 = (uchar)((uint)uVar5 >> 8);
        auVar43[1] = -(*(uchar *)((long)&p_Var3->_M_p + 1) == uVar40);
        uVar41 = (uchar)((uint)uVar5 >> 0x10);
        auVar43[2] = -(*(uchar *)((long)&p_Var3->_M_p + 2) == uVar41);
        uVar42 = (uchar)((uint)uVar5 >> 0x18);
        auVar43[3] = -(*(uchar *)((long)&p_Var3->_M_p + 3) == uVar42);
        auVar43[4] = -(*(uchar *)((long)&p_Var3->_M_p + 4) == uVar37);
        auVar43[5] = -(*(uchar *)((long)&p_Var3->_M_p + 5) == uVar40);
        auVar43[6] = -(*(uchar *)((long)&p_Var3->_M_p + 6) == uVar41);
        auVar43[7] = -(*(uchar *)((long)&p_Var3->_M_p + 7) == uVar42);
        auVar43[8] = -(((slot_type *)(p_Var3 + 1))->n == uVar37);
        auVar43[9] = -(((slot_type *)(p_Var3 + 1))[1].n == uVar40);
        auVar43[10] = -(((slot_type *)(p_Var3 + 1))[2].n == uVar41);
        auVar43[0xb] = -(((slot_type *)(p_Var3 + 1))[3].n == uVar42);
        auVar43[0xc] = -(((slot_type *)(p_Var3 + 1))[4].n == uVar37);
        auVar43[0xd] = -(((slot_type *)(p_Var3 + 1))[5].n == uVar40);
        auVar43[0xe] = -(((slot_type *)(p_Var3 + 1))[6].n == uVar41);
        auVar43[0xf] = -(((slot_type *)(p_Var3 + 1))[7].n == uVar42);
        for (uVar31 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe); uVar31 != 0;
            uVar31 = uVar31 - 1 & uVar31) {
          uVar13 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          if (local_290 ==
              *(DefinitionSymbol **)(local_178._8_8_ + (ulong)uVar13 * 8 + uVar22 * 0x78)) {
            lVar23 = local_178._8_8_ + (ulong)uVar13 * 8 + uVar22 * 0x78;
            goto LAB_003ddd7d;
          }
        }
        if ((*(byte *)((long)(local_178._0_8_ + 8) + uVar22 * 0x10 + 7) &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar24 & 7]) == 0) break;
        lVar23 = uVar22 + uVar29;
        uVar29 = uVar29 + 1;
        uVar22 = lVar23 + 1U & local_180;
      } while (uVar29 <= local_180);
      lVar23 = 0;
LAB_003ddd7d:
      if (lVar23 == 0) {
        if (local_288._8_8_ == local_288._16_8_) {
          std::
          vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
          ::_M_realloc_insert<slang::ast::DefinitionSymbol_const*const&>
                    ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                      *)local_288,(iterator)local_288._8_8_,&local_290);
        }
        else {
          *(DefinitionSymbol **)local_288._8_8_ = local_290;
          local_288._8_8_ = (DefinitionSymbol **)(local_288._8_8_ + 8);
        }
      }
    }
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::_M_move_assign(&this->unreferencedDefs,local_288);
    if ((pointer)local_288._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
    }
  }
  DiagnosticVisitor::~DiagnosticVisitor((DiagnosticVisitor *)local_200);
  return;
LAB_003dd9be:
  do {
    auVar38[0] = -(*puVar19 == '\0');
    auVar38[1] = -(puVar19[1] == '\0');
    auVar38[2] = -(puVar19[2] == '\0');
    auVar38[3] = -(puVar19[3] == '\0');
    auVar38[4] = -(puVar19[4] == '\0');
    auVar38[5] = -(puVar19[5] == '\0');
    auVar38[6] = -(puVar19[6] == '\0');
    auVar38[7] = -(puVar19[7] == '\0');
    auVar38[8] = -(puVar19[8] == '\0');
    auVar38[9] = -(puVar19[9] == '\0');
    auVar38[10] = -(puVar19[10] == '\0');
    auVar38[0xb] = -(puVar19[0xb] == '\0');
    auVar38[0xc] = -(puVar19[0xc] == '\0');
    auVar38[0xd] = -(puVar19[0xd] == '\0');
    auVar38[0xe] = -(puVar19[0xe] == '\0');
    auVar38[0xf] = -(puVar19[0xf] == '\0');
    uVar31 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
    if (uVar31 == 0x7fff) {
      puVar19 = puVar19 + 0x10;
      ppVar32 = ppVar32 + 0xf;
    }
    else {
      uVar13 = 0;
      if ((uVar31 ^ 0x7fff) != 0) {
        for (; ((uVar31 ^ 0x7fff) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      if (puVar19[uVar13] == '\x01') {
        ppVar32 = (table_element_pointer)0x0;
      }
      else {
        puVar19 = puVar19 + uVar13;
        ppVar32 = (table_element_pointer)
                  ((long)&(ppVar32->first).
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          .
                          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                          super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                  (ulong)(uVar13 << 6));
      }
    }
  } while (uVar31 == 0x7fff);
LAB_003dd9ab:
  iVar44.p_ = ppVar32;
  iVar44.pc_ = puVar19;
  if (ppVar32 == (table_element_pointer)0x0) goto LAB_003dda0d;
  goto LAB_003dd8a5;
LAB_003ddac2:
  do {
    auVar39[0] = -(*puVar33 == '\0');
    auVar39[1] = -(puVar33[1] == '\0');
    auVar39[2] = -(puVar33[2] == '\0');
    auVar39[3] = -(puVar33[3] == '\0');
    auVar39[4] = -(puVar33[4] == '\0');
    auVar39[5] = -(puVar33[5] == '\0');
    auVar39[6] = -(puVar33[6] == '\0');
    auVar39[7] = -(puVar33[7] == '\0');
    auVar39[8] = -(puVar33[8] == '\0');
    auVar39[9] = -(puVar33[9] == '\0');
    auVar39[10] = -(puVar33[10] == '\0');
    auVar39[0xb] = -(puVar33[0xb] == '\0');
    auVar39[0xc] = -(puVar33[0xc] == '\0');
    auVar39[0xd] = -(puVar33[0xd] == '\0');
    auVar39[0xe] = -(puVar33[0xe] == '\0');
    auVar39[0xf] = -(puVar33[0xf] == '\0');
    uVar31 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
    if (uVar31 == 0x7fff) {
      puVar33 = puVar33 + 0x10;
      ppVar35 = ppVar35 + 0xf;
    }
    else {
      uVar13 = 0;
      if ((uVar31 ^ 0x7fff) != 0) {
        for (; ((uVar31 ^ 0x7fff) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      if (puVar33[uVar13] == '\x01') {
        ppVar35 = (table_element_pointer)0x0;
      }
      else {
        puVar33 = puVar33 + uVar13;
        ppVar35 = ppVar35 + uVar13;
      }
    }
  } while (uVar31 == 0x7fff);
LAB_003ddab6:
  iVar46.p_ = ppVar35;
  iVar46.pc_ = puVar33;
  if (ppVar35 == (table_element_pointer)0x0) goto LAB_003ddb14;
  goto LAB_003dda68;
}

Assistant:

void Compilation::elaborate() {
    SLANG_ASSERT(!isFrozen());

    // Touch every symbol, scope, statement, and expression tree so that
    // we can be sure we have all the diagnostics.
    uint32_t errorLimit = options.errorLimit == 0 ? UINT32_MAX : options.errorLimit;
    DiagnosticVisitor elabVisitor(*this, numErrors, errorLimit);
    getRoot().visit(elabVisitor);

    if (elabVisitor.finishedEarly()) {
        sawFatalError = true;
        return;
    }

    elabVisitor.finalize();

    // Note for the following checks here: anything that depends on a list
    // stored in the compilation object should think carefully about taking
    // a copy of that list first before iterating over it, because your check
    // might trigger additional action that ends up adding to that list,
    // causing undefined behavior.

    // Check all DPI methods for correctness.
    if (!dpiExports.empty() || !elabVisitor.dpiImports.empty())
        checkDPIMethods(elabVisitor.dpiImports);

    // Check extern interface methods for correctness.
    if (!externInterfaceMethods.empty()) {
        auto methods = externInterfaceMethods;
        for (auto method : methods)
            method->connectExternInterfacePrototype();
    }

    if (!elabVisitor.externIfaceProtos.empty())
        checkExternIfaceMethods(elabVisitor.externIfaceProtos);

    if (!elabVisitor.modportsWithExports.empty())
        checkModportExports(elabVisitor.modportsWithExports);

    // Double check any bind directives for correctness. These were already
    // resolved prior to full elaboration but their diagnostics were not
    // issued so we need to check again.
    for (auto [directive, scope] : bindDirectives) {
        ResolvedBind resolvedBind;
        resolveBindTargets(*directive, *scope, resolvedBind);
        checkBindTargetParams(*directive, *scope, resolvedBind);
    }

    // Report any lingering name conflicts.
    if (!nameConflicts.empty()) {
        auto conflicts = nameConflicts;
        for (auto symbol : conflicts) {
            auto scope = symbol->getParentScope();
            SLANG_ASSERT(scope);
            scope->handleNameConflict(*symbol);
        }
    }

    // Report on unused out-of-block definitions. These are always a real error.
    if (!outOfBlockDecls.empty()) {
        auto decls = outOfBlockDecls;
        for (auto& [key, val] : decls) {
            auto& [syntax, name, index, used] = val;
            if (!used) {
                auto& [className, declName, scope] = key;
                auto classRange = name->left->sourceRange();
                auto sym = Lookup::unqualifiedAt(*scope, className,
                                                 LookupLocation(scope, uint32_t(index)),
                                                 classRange);

                if (sym && !declName.empty() && !className.empty()) {
                    if (sym->kind == SymbolKind::ClassType ||
                        sym->kind == SymbolKind::GenericClassDef) {
                        auto& diag = scope->addDiag(diag::NoDeclInClass, name->sourceRange());
                        diag << declName << className;
                    }
                    else {
                        auto& diag = scope->addDiag(diag::NotAClass, classRange);
                        diag << className;
                    }
                }
            }
        }
    }

    // Report on unused config rules.
    if (!configBlocks.empty()) {
        for (auto& [name, confList] : configBlocks) {
            for (auto config : confList) {
                if (config->isUsed)
                    config->checkUnusedRules();
            }
        }
    }

    if (!hasFlag(CompilationFlags::AllowTopLevelIfacePorts)) {
        // Top level instances cannot have interface or ref ports.
        for (auto inst : getRoot().topInstances) {
            for (auto port : inst->body.getPortList()) {
                if (port->kind == SymbolKind::InterfacePort) {
                    inst->body.addDiag(diag::TopModuleIfacePort, port->location)
                        << inst->name << port->name;
                    break;
                }
                else {
                    ArgumentDirection dir;
                    if (port->kind == SymbolKind::MultiPort)
                        dir = port->as<MultiPortSymbol>().direction;
                    else
                        dir = port->as<PortSymbol>().direction;

                    if (dir == ArgumentDirection::Ref) {
                        if (port->name.empty()) {
                            inst->body.addDiag(diag::TopModuleUnnamedRefPort, port->location)
                                << inst->name;
                        }
                        else {
                            inst->body.addDiag(diag::TopModuleRefPort, port->location)
                                << inst->name << port->name;
                        }
                    }
                }
            }
        }
    }

    // Remove definitions from the "unused" set if they were referenced
    // in an interface port somewhere.
    std::vector<const DefinitionSymbol*> newUnreferencedDefs;
    newUnreferencedDefs.reserve(unreferencedDefs.size());
    for (auto def : unreferencedDefs) {
        if (elabVisitor.usedIfacePorts.find(def) == elabVisitor.usedIfacePorts.end())
            newUnreferencedDefs.push_back(def);
    }
    unreferencedDefs = std::move(newUnreferencedDefs);
}